

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.cpp
# Opt level: O0

string * fs_resolve_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,bool strict,bool expand_tilde)

{
  string local_58;
  __sv_type local_38;
  undefined1 local_22;
  byte local_21;
  bool expand_tilde_local;
  size_t sStack_20;
  bool strict_local;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  sStack_20 = path._M_len;
  local_22 = expand_tilde;
  local_21 = strict;
  path_local._M_str = (char *)__return_storage_ptr__;
  fs_absolute_abi_cxx11_(&local_58,path,expand_tilde);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  fs_canonical_abi_cxx11_(__return_storage_ptr__,local_38,(bool)(local_21 & 1),false);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_resolve(std::string_view path, const bool strict, const bool expand_tilde)
{
  // works like canonical(absolute(path)).
  // Inspired by Python pathlib.Path.resolve()
  // https://docs.python.org/3/library/pathlib.html#pathlib.Path.resolve

  return fs_canonical(fs_absolute(path, expand_tilde), strict, false);
}